

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O2

void __thiscall
rest_rpc::rpc_service::connection::on_write(connection *this,error_code ec,size_t length)

{
  function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *this_00;
  void *__buf;
  int __fd;
  error_code local_50;
  shared_ptr<rest_rpc::rpc_service::connection> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_50._M_cat = ec._M_cat;
  __fd = ec._M_value;
  local_50._M_value = __fd;
  if (__fd == 0) {
    if (this->has_closed_ == false) {
      std::deque<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>::pop_front
                (&this->write_queue_);
      if ((this->write_queue_).
          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>._M_impl
          .super__Deque_impl_data._M_finish._M_cur !=
          (this->write_queue_).
          super__Deque_base<rest_rpc::message_type,_std::allocator<rest_rpc::message_type>_>._M_impl
          .super__Deque_impl_data._M_start._M_cur) {
        write(this,__fd,__buf,length);
        return;
      }
    }
  }
  else {
    print(this,&local_50);
    this_00 = this->on_net_err_;
    if (this_00 !=
        (function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
         *)0x0) {
      std::__shared_ptr<rest_rpc::rpc_service::connection,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<rest_rpc::rpc_service::connection,void>
                ((__shared_ptr<rest_rpc::rpc_service::connection,(__gnu_cxx::_Lock_policy)2> *)
                 &local_40,
                 (__weak_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2> *)this);
      (**(code **)(*(long *)local_50._M_cat + 0x20))(&local_30,local_50._M_cat,local_50._M_value);
      std::
      function<void_(std::shared_ptr<rest_rpc::rpc_service::connection>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()(this_00,&local_40,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_40.
                  super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    close(this,0);
  }
  return;
}

Assistant:

void on_write(asio::error_code ec, std::size_t length) {
    if (ec) {
      print(ec);
      if (on_net_err_) {
        (*on_net_err_)(shared_from_this(), ec.message());
      }
      close(false);
      return;
    }

    if (has_closed()) {
      return;
    }

    write_queue_.pop_front();

    if (!write_queue_.empty()) {
      write();
    }
  }